

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Frame * pbrt::Frame::FromXZ(Frame *__return_storage_ptr__,Vector3f x,Vector3f z)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar5 [64];
  Vector3<float> VVar6;
  Tuple3<pbrt::Vector3,_float> local_30;
  Tuple3<pbrt::Vector3,_float> local_20;
  
  local_30.z = z.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._8_56_ = z._8_56_;
  auVar5._0_8_ = z.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = x.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_20._0_8_ = vmovlps_avx(auVar2);
  local_30._0_8_ = vmovlps_avx(auVar5._0_16_);
  local_20.z = x.super_Tuple3<pbrt::Vector3,_float>.z;
  VVar6 = Cross<float>((Vector3<float> *)&local_30,(Vector3<float> *)&local_20);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = x.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uVar1 = vmovlps_avx(auVar4);
  (__return_storage_ptr__->x).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->x).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->x).super_Tuple3<pbrt::Vector3,_float>.z =
       x.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._8_8_ = extraout_XMM0_Qb;
  auVar3._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uVar1 = vmovlps_avx(auVar3);
  (__return_storage_ptr__->y).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->y).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->y).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  (__return_storage_ptr__->z).super_Tuple3<pbrt::Vector3,_float>.x = local_30.x;
  (__return_storage_ptr__->z).super_Tuple3<pbrt::Vector3,_float>.y = local_30.y;
  (__return_storage_ptr__->z).super_Tuple3<pbrt::Vector3,_float>.z = local_30.z;
  return __return_storage_ptr__;
}

Assistant:

static Frame FromXZ(Vector3f x, Vector3f z) { return Frame(x, Cross(z, x), z); }